

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

u16 __thiscall moira::Moira::availabilityMask(Moira *this,Instr I,Mode M,Size S)

{
  bool bVar1;
  u16 local_1e;
  u16 mask;
  Size S_local;
  Mode M_local;
  Instr I_local;
  Moira *this_local;
  
  local_1e = availabilityMask(this,I);
  switch(I) {
  case BCC:
  case BCS:
  case BEQ:
  case BGE:
  case BGT:
  case BHI:
  case BLE:
  case BLS:
  case BLT:
  case BMI:
  case BNE:
  case BPL:
  case BVC:
  case BVS:
  case BRA:
  case BSR:
  case CHK:
  case LINK:
    if (S == 4) {
      local_1e = local_1e & 0x1fc;
    }
    break;
  default:
    break;
  case CMPI:
    bVar1 = isPrgMode(M);
    if (bVar1) {
      local_1e = local_1e & 0x1fe;
    }
    break;
  case TST:
    if ((M == AN) || (8 < (int)M)) {
      local_1e = local_1e & 0x1fc;
    }
  }
  return local_1e;
}

Assistant:

u16
Moira::availabilityMask(Instr I, Mode M, Size S) const
{
    u16 mask = availabilityMask(I);

    switch (I) {

        case Instr::CMPI:

            if (isPrgMode(M)) mask &= AV::M68010_UP;
            break;

        case Instr::CHK: case Instr::LINK: case Instr::BRA: case Instr::BHI: case Instr::BLS: case Instr::BCC: case Instr::BCS:
        case Instr::BNE: case Instr::BEQ: case Instr::BVC: case Instr::BVS: case Instr::BPL: case Instr::BMI: case Instr::BGE:
        case Instr::BLT: case Instr::BGT: case Instr::BLE: case Instr::BSR:

            if (S == Long) mask &= AV::M68020_UP;
            break;

        case Instr::TST:

            if (M == Mode(1) || M >= Mode(9)) mask &= AV::M68020_UP;
            break;

        default:

            break;
    }

    return mask;
}